

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall gmlc::networking::TcpServer::initialConnect(TcpServer *this)

{
  service_type *psVar1;
  _Manager_type p_Var2;
  pointer pbVar3;
  pointer psVar4;
  TcpAcceptor *pTVar5;
  per_descriptor_data pdVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RCX;
  ulong uVar12;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  sockaddr *extraout_RDX_05;
  sockaddr *extraout_RDX_06;
  sockaddr *extraout_RDX_07;
  sockaddr *extraout_RDX_08;
  pointer psVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  shared_ptr<gmlc::networking::TcpAcceptor> *in_RSI;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  _Manager_type p_Var18;
  undefined8 uVar19;
  uint __uval;
  uint uVar20;
  pointer ep;
  ulong uVar21;
  pointer acc;
  string __str_1;
  string __str;
  string __str_2;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_98;
  _Any_data local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  
  if (((this->halted)._M_base._M_i & 1U) == 0) {
    ep = (this->endpoints).
         super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->endpoints).
             super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ep != pbVar3) {
      in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&this->logFunction;
      local_98 = (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)in_RCX;
      do {
        TcpAcceptor::create((TcpAcceptor *)local_158,this->ioctx,ep);
        if (this->reuse_address == true) {
          local_138._M_dataplus._M_p._0_4_ = 1;
          asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
          set_option<asio::detail::socket_option::boolean<1,2>>
                    ((basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *)
                     (local_158._0_8_ + 0x30),(boolean<1,_2> *)(local_148 + 0x10));
        }
        else {
          local_138._M_dataplus._M_p =
               (pointer)((ulong)(uint)local_138._M_dataplus._M_p._4_4_ << 0x20);
          asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
          set_option<asio::detail::socket_option::boolean<1,2>>
                    ((basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *)
                     (local_158._0_8_ + 0x30),(boolean<1,_2> *)(local_148 + 0x10));
        }
        local_70._8_8_ = 0;
        local_58 = std::
                   _Function_handler<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpServer.cpp:159:13)>
                   ::_M_invoke;
        local_60 = std::
                   _Function_handler<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpServer.cpp:159:13)>
                   ::_M_manager;
        local_70._M_unused._M_object = this;
        std::
        function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
        ::operator=((function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
                     *)(local_158._0_8_ + 0x88),
                    (function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
                     *)&local_70);
        if (local_60 != (code *)0x0) {
          (*local_60)(&local_70,&local_70,3);
        }
        uVar19 = local_158._0_8_;
        if ((this->logFunction).super__Function_base._M_manager != (_Manager_type)0x0) {
          std::
          function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function(&local_50,local_98);
          TcpAcceptor::setLoggingFunction((TcpAcceptor *)uVar19,&local_50);
          if ((__pthread_internal_list *)local_50.super__Function_base._M_manager !=
              (__pthread_internal_list *)0x0) {
            (*local_50.super__Function_base._M_manager)(&local_50,&local_50,3);
          }
        }
        in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)local_158;
        std::
        vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>>>
        ::emplace_back<std::shared_ptr<gmlc::networking::TcpAcceptor>>
                  ((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>>>
                    *)&this->acceptors,in_RSI);
        in_RDX = extraout_RDX;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
          in_RDX = extraout_RDX_00;
        }
        ep = ep + 1;
      } while (ep != pbVar3);
    }
    psVar13 = (this->acceptors).
              super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->acceptors).
             super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar13 != psVar4) {
      uVar21 = 0;
      local_98 = (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)0x0;
      uVar16 = 0;
      do {
        uVar20 = uVar16 + 1;
        iVar10 = TcpAcceptor::connect
                           ((psVar13->
                            super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr,(int)in_RSI,in_RDX,(socklen_t)in_RCX);
        if ((char)iVar10 == '\0') {
          local_b8._0_8_ = &local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"unable to connect acceptor ","");
          uVar14 = 1;
          if (8 < uVar16) {
            uVar16 = uVar20;
            uVar9 = 4;
            do {
              uVar14 = uVar9;
              if (uVar16 < 100) {
                uVar14 = uVar14 - 2;
                goto LAB_004003fe;
              }
              if (uVar16 < 1000) {
                uVar14 = uVar14 - 1;
                goto LAB_004003fe;
              }
              if (uVar16 < 10000) goto LAB_004003fe;
              bVar8 = 99999 < uVar16;
              uVar16 = uVar16 / 10000;
              uVar9 = uVar14 + 4;
            } while (bVar8);
            uVar14 = uVar14 + 1;
          }
LAB_004003fe:
          local_d8._0_8_ = &local_c8;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,(ulong)uVar14,'-');
          CLI::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d8._0_8_,uVar14,uVar20)
          ;
          uVar19 = (service_type *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._0_8_ != &local_a8) {
            uVar19 = local_a8._M_allocated_capacity;
          }
          if ((ulong)uVar19 < (service_type *)(local_d8._8_8_ + local_b8._8_8_)) {
            uVar19 = (service_type *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._0_8_ != &local_c8) {
              uVar19 = local_c8._M_allocated_capacity;
            }
            if ((ulong)uVar19 < (service_type *)(local_d8._8_8_ + local_b8._8_8_))
            goto LAB_004004a0;
            pbVar11 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_d8,0,0,(char *)local_b8._0_8_,local_b8._8_8_);
          }
          else {
LAB_004004a0:
            pbVar11 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b8,(char *)local_d8._0_8_,local_d8._8_8_);
          }
          local_118._0_8_ = (pbVar11->_M_dataplus)._M_p;
          paVar17 = &pbVar11->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._0_8_ == paVar17) {
            local_118._16_8_ = paVar17->_M_allocated_capacity;
            local_118._24_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_118._0_8_ = (per_descriptor_data)(local_118 + 0x10);
          }
          else {
            local_118._16_8_ = paVar17->_M_allocated_capacity;
          }
          local_118._8_8_ = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar11->_M_string_length = 0;
          paVar17->_M_local_buf[0] = '\0';
          pbVar11 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_118," of ");
          local_138._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
          paVar17 = &pbVar11->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p == paVar17) {
            local_138.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          }
          else {
            local_138.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          }
          local_138._M_string_length = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          uVar15 = (long)(this->acceptors).
                         super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->acceptors).
                         super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          uVar16 = 1;
          if (9 < uVar15) {
            uVar12 = uVar15;
            uVar14 = 4;
            do {
              uVar16 = uVar14;
              if (uVar12 < 100) {
                uVar16 = uVar16 - 2;
                goto LAB_004005c2;
              }
              if (uVar12 < 1000) {
                uVar16 = uVar16 - 1;
                goto LAB_004005c2;
              }
              if (uVar12 < 10000) goto LAB_004005c2;
              bVar8 = 99999 < uVar12;
              uVar12 = uVar12 / 10000;
              uVar14 = uVar16 + 4;
            } while (bVar8);
            uVar16 = uVar16 + 1;
          }
LAB_004005c2:
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_f8,(ulong)uVar16,'\0');
          CLI::std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_f8._M_dataplus._M_p,(uint)local_f8._M_string_length,uVar15);
          uVar19 = (service_type *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            uVar19 = local_138.field_2._M_allocated_capacity;
          }
          psVar1 = (service_type *)
                   (CONCAT44(local_f8._M_string_length._4_4_,(uint)local_f8._M_string_length) +
                   local_138._M_string_length);
          if ((ulong)uVar19 < psVar1) {
            uVar19 = (service_type *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              uVar19 = local_f8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar19 < psVar1) goto LAB_00400646;
            pbVar11 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                (&local_f8,0,0,local_138._M_dataplus._M_p,local_138._M_string_length
                                );
          }
          else {
LAB_00400646:
            pbVar11 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_148 + 0x10),local_f8._M_dataplus._M_p,
                                 CONCAT44(local_f8._M_string_length._4_4_,
                                          (uint)local_f8._M_string_length));
          }
          local_158._0_8_ = local_158 + 0x10;
          pTVar5 = (TcpAcceptor *)(pbVar11->_M_dataplus)._M_p;
          in_RCX = &pbVar11->field_2;
          if (pTVar5 == (TcpAcceptor *)in_RCX) {
            local_148._0_8_ = in_RCX->_M_allocated_capacity;
            local_148._8_8_ = *(uchar (*) [8])((long)&pbVar11->field_2 + 8);
          }
          else {
            local_148._0_8_ = in_RCX->_M_allocated_capacity;
            local_158._0_8_ = pTVar5;
          }
          local_158._8_8_ = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)in_RCX;
          pbVar11->_M_string_length = 0;
          in_RCX->_M_local_buf[0] = '\0';
          in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)0x0;
          logger(this,0,(string *)local_158);
          in_RDX = extraout_RDX_02;
          if ((TcpAcceptor *)local_158._0_8_ != (TcpAcceptor *)(local_158 + 0x10)) {
            in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)(local_148._0_8_ + 1);
            operator_delete((void *)local_158._0_8_,(ulong)in_RSI);
            in_RDX = extraout_RDX_03;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)
                     (local_f8.field_2._M_allocated_capacity + 1);
            operator_delete(local_f8._M_dataplus._M_p,(ulong)in_RSI);
            in_RDX = extraout_RDX_04;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)
                     (local_138.field_2._M_allocated_capacity + 1);
            operator_delete(local_138._M_dataplus._M_p,(ulong)in_RSI);
            in_RDX = extraout_RDX_05;
          }
          if ((per_descriptor_data)local_118._0_8_ != (per_descriptor_data)(local_118 + 0x10)) {
            in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)(local_118._16_8_ + 1);
            operator_delete((void *)local_118._0_8_,(ulong)in_RSI);
            in_RDX = extraout_RDX_06;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._0_8_ != &local_c8) {
            in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)
                     (local_c8._M_allocated_capacity + 1);
            operator_delete((void *)local_d8._0_8_,(ulong)in_RSI);
            in_RDX = extraout_RDX_07;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._0_8_ != &local_a8) {
            in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)
                     (local_a8._M_allocated_capacity + 1);
            operator_delete((void *)local_b8._0_8_,(ulong)in_RSI);
            in_RDX = extraout_RDX_08;
          }
        }
        else {
          uVar21 = uVar21 + 1;
          local_98 = (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)CONCAT71((int7)(CONCAT44(extraout_var,iVar10) >> 8),1);
          in_RDX = extraout_RDX_01;
        }
        psVar13 = psVar13 + 1;
        uVar16 = uVar20;
      } while (psVar13 != psVar4);
      if (((ulong)local_98 & 1) != 0) {
        if ((ulong)((long)(this->acceptors).
                          super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->acceptors).
                          super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar21) {
          return;
        }
        local_d8._0_8_ = &local_c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,"partial connection on the server ","");
        uVar16 = 1;
        if (9 < uVar21) {
          uVar15 = uVar21;
          uVar20 = 4;
          do {
            uVar16 = uVar20;
            if (uVar15 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_004008a4;
            }
            if (uVar15 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_004008a4;
            }
            if (uVar15 < 10000) goto LAB_004008a4;
            bVar8 = 99999 < uVar15;
            uVar15 = uVar15 / 10000;
            uVar20 = uVar16 + 4;
          } while (bVar8);
          uVar16 = uVar16 + 1;
        }
LAB_004008a4:
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_f8,(ulong)uVar16,'\0');
        CLI::std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_f8._M_dataplus._M_p,(uint)local_f8._M_string_length,uVar21);
        psVar1 = (service_type *)
                 (CONCAT44(local_f8._M_string_length._4_4_,(uint)local_f8._M_string_length) +
                 local_d8._8_8_);
        uVar19 = (service_type *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._0_8_ != &local_c8) {
          uVar19 = local_c8._M_allocated_capacity;
        }
        if ((ulong)uVar19 < psVar1) {
          uVar19 = (service_type *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            uVar19 = local_f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < psVar1) goto LAB_0040092a;
          pbVar11 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                              (&local_f8,0,0,(char *)local_d8._0_8_,local_d8._8_8_);
        }
        else {
LAB_0040092a:
          pbVar11 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_d8,local_f8._M_dataplus._M_p,
                               CONCAT44(local_f8._M_string_length._4_4_,
                                        (uint)local_f8._M_string_length));
        }
        local_b8._0_8_ = (pbVar11->_M_dataplus)._M_p;
        paVar17 = &pbVar11->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._0_8_ == paVar17) {
          local_a8._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_a8._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
          local_b8._0_8_ = &local_a8;
        }
        else {
          local_a8._M_allocated_capacity = paVar17->_M_allocated_capacity;
        }
        local_b8._8_8_ = pbVar11->_M_string_length;
        (pbVar11->_M_dataplus)._M_p = (pointer)paVar17;
        pbVar11->_M_string_length = 0;
        paVar17->_M_local_buf[0] = '\0';
        pbVar11 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b8," of ");
        local_118._0_8_ = local_118 + 0x10;
        pdVar6 = (per_descriptor_data)(pbVar11->_M_dataplus)._M_p;
        paVar17 = &pbVar11->field_2;
        if (pdVar6 == (per_descriptor_data)paVar17) {
          local_118._16_8_ = paVar17->_M_allocated_capacity;
          local_118._24_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        }
        else {
          local_118._16_8_ = paVar17->_M_allocated_capacity;
          local_118._0_8_ = pdVar6;
        }
        local_118._8_8_ = pbVar11->_M_string_length;
        (pbVar11->_M_dataplus)._M_p = (pointer)paVar17;
        pbVar11->_M_string_length = 0;
        (pbVar11->field_2)._M_local_buf[0] = '\0';
        uVar21 = (long)(this->acceptors).
                       super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->acceptors).
                       super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4;
        uVar16 = 1;
        if (9 < uVar21) {
          uVar15 = uVar21;
          uVar20 = 4;
          do {
            uVar16 = uVar20;
            if (uVar15 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_00400a5a;
            }
            if (uVar15 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_00400a5a;
            }
            if (uVar15 < 10000) goto LAB_00400a5a;
            bVar8 = 99999 < uVar15;
            uVar15 = uVar15 / 10000;
            uVar20 = uVar16 + 4;
          } while (bVar8);
          uVar16 = uVar16 + 1;
        }
LAB_00400a5a:
        local_90._M_unused._M_object = &local_80;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                     (ulong)uVar16,'\0');
        CLI::std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_90._M_unused._0_8_,local_90._8_4_,uVar21);
        p_Var2 = (_Manager_type)(CONCAT44(local_90._12_4_,local_90._8_4_) + local_118._8_8_);
        p_Var18 = (_Manager_type)0xf;
        if ((per_descriptor_data)local_118._0_8_ != (per_descriptor_data)(local_118 + 0x10)) {
          p_Var18 = (_Manager_type)local_118._16_8_;
        }
        if (p_Var18 < p_Var2) {
          uVar19 = (_Manager_type)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_unused._0_8_ != &local_80) {
            uVar19 = local_80._M_allocated_capacity;
          }
          if ((ulong)uVar19 < p_Var2) goto LAB_00400ae1;
          pbVar11 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_90,0,0,(char *)local_118._0_8_,local_118._8_8_);
        }
        else {
LAB_00400ae1:
          pbVar11 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_118,(char *)local_90._M_unused._0_8_,
                               CONCAT44(local_90._12_4_,local_90._8_4_));
        }
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar11->_M_dataplus)._M_p;
        paVar17 = &pbVar11->field_2;
        if (paVar7 == paVar17) {
          local_138.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        }
        else {
          local_138.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_138._M_dataplus._M_p = (pointer)paVar7;
        }
        local_138._M_string_length = pbVar11->_M_string_length;
        (pbVar11->_M_dataplus)._M_p = (pointer)paVar17;
        pbVar11->_M_string_length = 0;
        paVar17->_M_local_buf[0] = '\0';
        pbVar11 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_148 + 0x10)," were connected");
        local_158._0_8_ = (pbVar11->_M_dataplus)._M_p;
        paVar17 = &pbVar11->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._0_8_ == paVar17) {
          local_148._0_8_ = paVar17->_M_allocated_capacity;
          local_148._8_8_ = *(uchar (*) [8])((long)&pbVar11->field_2 + 8);
          local_158._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_158 + 0x10);
        }
        else {
          local_148._0_8_ = paVar17->_M_allocated_capacity;
        }
        local_158._8_8_ = pbVar11->_M_string_length;
        (pbVar11->_M_dataplus)._M_p = (pointer)paVar17;
        pbVar11->_M_string_length = 0;
        (pbVar11->field_2)._M_local_buf[0] = '\0';
        logger(this,1,(string *)local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          (ulong)(local_138.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_unused._0_8_ != &local_80) {
          operator_delete(local_90._M_unused._M_object,(ulong)(local_80._M_allocated_capacity + 1));
        }
        if ((per_descriptor_data)local_118._0_8_ != (per_descriptor_data)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._0_8_ != &local_a8) {
          operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          (ulong)(local_f8.field_2._M_allocated_capacity + 1));
        }
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._0_8_ == &local_c8) {
          return;
        }
        goto LAB_00400883;
      }
    }
    LOCK();
    (this->halted)._M_base._M_i = true;
    UNLOCK();
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,"halting server operation","");
    logger(this,1,(string *)local_158);
  }
  else {
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,"previously halted server","");
    logger(this,0,(string *)local_158);
  }
  local_c8._M_allocated_capacity = local_148._0_8_;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._0_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_158 + 0x10)) {
    return;
  }
LAB_00400883:
  operator_delete(paVar17,(ulong)((long)&(((service_type *)local_c8._M_allocated_capacity)->
                                         super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
                                         ).super_service._vptr_service + 1));
  return;
}

Assistant:

void TcpServer::initialConnect()
{
    if (halted.load(std::memory_order_acquire)) {
        logger(0, "previously halted server");
        return;
    }
    for (auto& ep : endpoints) {
        auto acc = TcpAcceptor::create(ioctx, ep);
        if (reuse_address) {
            acc->set_option(tcp::acceptor::reuse_address(true));
        } else {
            acc->set_option(tcp::acceptor::reuse_address(false));
        }
        acc->setAcceptCall(
            [this](TcpAcceptor::pointer accPtr, TcpConnection::pointer conn) {
                handle_accept(std::move(accPtr), std::move(conn));
            });
        if (logFunction) {
            acc->setLoggingFunction(logFunction);
        }
        acceptors.push_back(std::move(acc));
    }
    bool anyConnect = false;
    size_t connectedAcceptors = 0;
    int index = 0;
    for (auto& acc : acceptors) {
        ++index;
        if (!acc->connect()) {
            logger(
                0,
                std::string("unable to connect acceptor ") +
                    std::to_string(index) + " of " +
                    std::to_string(acceptors.size()));
            continue;
        }
        ++connectedAcceptors;
        anyConnect = true;
    }
    if (!anyConnect) {
        halted = true;
        logger(1, "halting server operation");
        return;
    }
    if (connectedAcceptors < acceptors.size()) {
        logger(
            1,
            std::string("partial connection on the server ") +
                std::to_string(connectedAcceptors) + " of " +
                std::to_string(acceptors.size()) + " were connected");
    }
}